

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::toString(String *__return_storage_ptr__,double in)

{
  double in_local;
  
  anon_unknown_14::fpToString<double>(__return_storage_ptr__,in,10);
  return __return_storage_ptr__;
}

Assistant:

String toString(double in) { return fpToString(in, 10); }